

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_input_event_loop.cpp
# Opt level: O0

bool __thiscall cppurses::detail::User_input_event_loop::loop_function(User_input_event_loop *this)

{
  bool bVar1;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> local_30;
  undefined4 local_24;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> local_20;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> event;
  User_input_event_loop *this_local;
  
  event._M_t.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t.
  super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
  super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
       (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)this;
  input::get();
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (!bVar1) {
    std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::unique_ptr
              (&local_30,&local_20);
    System::post_event(&local_30);
    std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr(&local_30);
  }
  this_local._7_1_ = !bVar1;
  local_24 = 1;
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr(&local_20);
  return this_local._7_1_;
}

Assistant:

auto User_input_event_loop::loop_function() -> bool
{
    auto event = input::get();
    if (event == nullptr)
        return false;
    System::post_event(std::move(event));
    return true;
}